

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O1

void __thiscall
MT32Emu::LA32FloatPartialPair::initSynth
          (LA32FloatPartialPair *this,PairType useMaster,bool sawtoothWaveform,Bit8u pulseWidth,
          Bit8u resonance)

{
  LA32FloatWaveGenerator *pLVar1;
  LA32FloatWaveGenerator *pLVar2;
  LA32FloatWaveGenerator *pLVar3;
  LA32FloatWaveGenerator *pLVar4;
  bool bVar5;
  
  pLVar1 = &this->master;
  pLVar2 = &this->master;
  bVar5 = useMaster != MASTER;
  pLVar3 = &this->master;
  if (bVar5) {
    pLVar3 = &this->slave;
  }
  pLVar3->sawtoothWaveform = sawtoothWaveform;
  pLVar3 = &this->master;
  if (bVar5) {
    pLVar3 = &this->slave;
  }
  pLVar3->pulseWidth = pulseWidth;
  pLVar3 = &this->master;
  if (bVar5) {
    pLVar3 = &this->slave;
  }
  pLVar3->resonance = resonance;
  pLVar3 = &this->master;
  pLVar4 = &this->master;
  if (bVar5) {
    pLVar3 = &this->slave;
    pLVar4 = &this->slave;
  }
  pLVar4->wavePos = 0.0;
  pLVar3->lastFreq = 0.0;
  if (bVar5) {
    pLVar1 = &this->slave;
    pLVar2 = &this->slave;
  }
  pLVar2->pcmWaveAddress = (Bit16s *)0x0;
  pLVar1->active = true;
  return;
}

Assistant:

void LA32FloatPartialPair::initSynth(const PairType useMaster, const bool sawtoothWaveform, const Bit8u pulseWidth, const Bit8u resonance) {
	if (useMaster == MASTER) {
		master.initSynth(sawtoothWaveform, pulseWidth, resonance);
	} else {
		slave.initSynth(sawtoothWaveform, pulseWidth, resonance);
	}
}